

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

pair<unsigned_long,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,size_t groupIndex)

{
  iterator *piVar1;
  char **ppcVar2;
  _Base_ptr p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer pBVar5;
  size_type sVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  int iVar9;
  string *psVar10;
  char *pcVar11;
  cmValue cVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar13;
  pointer this_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar14;
  pair<unsigned_long,_bool> pVar15;
  basic_string_view<char,_std::char_traits<char>_> __str;
  BFSEntry qe;
  string var;
  BFSEntry local_a8;
  undefined8 uStack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  size_t local_78;
  char **local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  string local_50;
  
  pVar14 = AllocateLinkEntry(this,item);
  p_Var3 = pVar14.first._M_node._M_node[4]._M_parent;
  if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar13 = 0;
    goto LAB_00562ab8;
  }
  this_01 = (this->EntryList).
            super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ._M_impl.super__Vector_impl_data._M_start + (long)p_Var3;
  local_78 = groupIndex;
  psVar10 = cmLinkItem::AsStr_abi_cxx11_(item);
  pcVar4 = (psVar10->_M_dataplus)._M_p;
  local_70 = (char **)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + psVar10->_M_string_length);
  local_88 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_80 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
    }
  }
  ppcVar2 = &local_a8.LibDepends;
  if (local_70 == (char **)&local_60) {
    uStack_90 = uStack_58;
    local_a8.Index = (size_t)ppcVar2;
  }
  else {
    local_a8.Index = (size_t)local_70;
  }
  local_a8.LibDepends = (char *)CONCAT71(uStack_5f,local_60);
  local_a8.GroupIndex = local_68;
  local_68 = 0;
  local_60 = 0;
  local_70 = (char **)&local_60;
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_a8);
  p_Var8 = p_Stack_80;
  peVar7 = local_88;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(this_01->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
  (this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar7;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))
  ->_M_pi = p_Var8;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((char **)local_a8.Index != ppcVar2) {
    operator_delete((void *)local_a8.Index,(ulong)(local_a8.LibDepends + 1));
  }
  if (local_70 != (char **)&local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  this_01->Target = item->Target;
  psVar10 = &this_01->Feature;
  std::__cxx11::string::_M_assign((string *)psVar10);
  pcVar11 = (this_01->Item).Value._M_dataplus._M_p;
  if (((this_01->Target == (cmGeneratorTarget *)0x0) && (*pcVar11 == '-')) && (pcVar11[1] != 'l')) {
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)this_01);
    iVar9 = std::__cxx11::string::compare((char *)&local_a8);
    if ((char **)local_a8.Index != ppcVar2) {
      operator_delete((void *)local_a8.Index,(ulong)(local_a8.LibDepends + 1));
    }
    if (iVar9 == 0) {
      pcVar11 = (this_01->Item).Value._M_dataplus._M_p;
      goto LAB_005628e7;
    }
    this_01->Kind = Flag;
    std::__cxx11::string::_M_assign((string *)psVar10);
  }
  else {
LAB_005628e7:
    local_a8.Index = (this_01->Item).Value._M_string_length;
    __str._M_str = DAT_00a39708;
    __str._M_len = (anonymous_namespace)::LG_BEGIN;
    local_a8.GroupIndex = (size_t)pcVar11;
    iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_a8,0,
                       (anonymous_namespace)::LG_BEGIN,__str);
    if (((iVar9 == 0) && (sVar6 = (this_01->Item).Value._M_string_length, sVar6 != 0)) &&
       (*(char *)(*(long *)&(this_01->Item).Value._M_dataplus + -1 + sVar6) == '>')) {
      this_01->Kind = Group;
    }
  }
  uVar13 = CONCAT71((int7)((ulong)psVar10 >> 8),1);
  if (this_01->Kind != Group) {
    if (this_01->Target == (cmGeneratorTarget *)0x0) {
      local_a8.GroupIndex = *(size_t *)&(this_01->Item).Value._M_dataplus;
      local_a8.Index = (this_01->Item).Value._M_string_length;
      local_a8.LibDepends = (pointer)0x0;
      uStack_90 = 0xc;
      local_88 = (element_type *)0x7b0187;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      views._M_len = 2;
      views._M_array = (iterator)&local_a8;
      cmCatViews(&local_50,views);
      cVar12 = cmMakefile::GetDefinition(this->Makefile,&local_50);
      if (cVar12.Value == (string *)0x0) {
        if (this_01->Kind != Flag) {
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var3].Initialized = true;
        }
      }
      else {
        local_a8.GroupIndex = local_78;
        local_a8.LibDepends = ((cVar12.Value)->_M_dataplus)._M_p;
        pBVar5 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pBVar5 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          local_a8.Index = (size_t)p_Var3;
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_a8);
        }
        else {
          pBVar5->LibDepends = local_a8.LibDepends;
          pBVar5->Index = (size_t)p_Var3;
          pBVar5->GroupIndex = local_78;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
          local_a8.Index = (size_t)p_Var3;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_a8.GroupIndex = local_78;
      local_a8.LibDepends = (char *)0x0;
      pBVar5 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar5 == (this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_a8.Index = (size_t)p_Var3;
        std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
        _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                  ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                    *)&this->BFSQueue,&local_a8);
      }
      else {
        pBVar5->LibDepends = (char *)0x0;
        pBVar5->Index = (size_t)p_Var3;
        pBVar5->GroupIndex = local_78;
        piVar1 = &(this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
LAB_00562ab8:
  pVar15._8_8_ = uVar13 & 0xffffffff;
  pVar15.first = (unsigned_long)p_Var3;
  return pVar15;
}

Assistant:

std::pair<size_t, bool> cmComputeLinkDepends::AddLinkEntry(
  cmLinkItem const& item, size_t groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  size_t index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  entry.Feature = item.Feature;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
    entry.Feature = LinkEntry::DEFAULT;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}